

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-source-line-finder.cc
# Opt level: O1

Result __thiscall
wabt::LexerSourceLineFinder::GetSourceLine
          (LexerSourceLineFinder *this,Location *loc,Offset max_line_length,
          SourceLine *out_source_line)

{
  unsigned_long uVar1;
  Result RVar2;
  LexerSourceLineFinder *pLVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  pointer pcVar6;
  Enum EVar7;
  Offset in_R8;
  OffsetRange range;
  OffsetRange OVar8;
  OffsetRange original;
  vector<char,_std::allocator<char>_> read_line;
  OffsetRange local_58;
  vector<char,_std::allocator<char>_> local_48;
  
  uVar4 = *(unsigned_long *)((long)&(loc->field_1).field_1.offset + 4);
  local_58.start = 0;
  local_58.end = 0;
  RVar2 = GetLineOffsets(this,(loc->field_1).field_0.line,&local_58);
  uVar1 = local_58.end;
  uVar5 = local_58.start;
  EVar7 = Error;
  if (RVar2.enum_ != Error) {
    OVar8.end = uVar4;
    OVar8.start = local_58.end;
    OVar8 = ClampSourceLineOffsets
                      ((LexerSourceLineFinder *)local_58.start,OVar8,(ColumnRange)max_line_length,
                       in_R8);
    uVar4 = OVar8.end;
    pLVar3 = (LexerSourceLineFinder *)OVar8.start;
    out_source_line->column_offset = (int)OVar8.start - (int)uVar5;
    if (pLVar3 != (LexerSourceLineFinder *)uVar5) {
      std::__cxx11::string::append((char *)out_source_line);
      pLVar3 = (LexerSourceLineFinder *)
               ((long)&(pLVar3->source_)._M_t.
                       super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>
                       .super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl + 3);
    }
    uVar5 = uVar4 - 3;
    if (uVar1 == uVar4) {
      uVar5 = uVar4;
    }
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    range.end = uVar5;
    range.start = (unsigned_long)pLVar3;
    RVar2 = LexerSource::ReadRange
                      ((this->source_)._M_t.
                       super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>
                       .super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl,range,
                       &local_48);
    EVar7 = Error;
    if (RVar2.enum_ != Error) {
      pcVar6 = (out_source_line->line)._M_dataplus._M_p + (out_source_line->line)._M_string_length;
      std::__cxx11::string::
      _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                ((string *)out_source_line,pcVar6,pcVar6,
                 local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      EVar7 = Ok;
      if (uVar1 != uVar4) {
        std::__cxx11::string::append((char *)out_source_line);
        EVar7 = Ok;
      }
    }
    if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return (Result)EVar7;
}

Assistant:

Result LexerSourceLineFinder::GetSourceLine(const Location& loc,
                                            Offset max_line_length,
                                            SourceLine* out_source_line) {
  ColumnRange column_range(loc.first_column, loc.last_column);
  OffsetRange original;
  CHECK_RESULT(GetLineOffsets(loc.line, &original));

  OffsetRange clamped =
      ClampSourceLineOffsets(original, column_range, max_line_length);
  bool has_start_ellipsis = original.start != clamped.start;
  bool has_end_ellipsis = original.end != clamped.end;

  out_source_line->column_offset = clamped.start - original.start;

  if (has_start_ellipsis) {
    out_source_line->line += "...";
    clamped.start += 3;
  }
  if (has_end_ellipsis) {
    clamped.end -= 3;
  }

  std::vector<char> read_line;
  CHECK_RESULT(source_->ReadRange(clamped, &read_line));
  out_source_line->line.append(read_line.begin(), read_line.end());

  if (has_end_ellipsis) {
    out_source_line->line += "...";
  }

  return Result::Ok;
}